

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeMathObject
               (DynamicObject *mathObject,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  undefined1 *builtInFuncs;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  uint64 uVar3;
  uint64 uVar4;
  undefined4 *puVar5;
  RuntimeFunction *pRVar6;
  ThreadConfiguration *pTVar7;
  StaticType *type;
  LiteralString *pLVar8;
  ScriptContext *scriptContext;
  
  DeferredTypeHandlerBase::Convert(typeHandler,mathObject,mode,0x2a,0);
  this = (((mathObject->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar3 = NumberUtilities::ToSpecial(2.718281828459045);
  bVar2 = NumberUtilities::IsNan(2.718281828459045);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(2.718281828459045);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(2.718281828459045);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00be30ae;
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x75,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  uVar3 = NumberUtilities::ToSpecial(2.302585092994046);
  bVar2 = NumberUtilities::IsNan(2.302585092994046);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(2.302585092994046);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(2.302585092994046);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00be30ae;
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0xd3,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  uVar3 = NumberUtilities::ToSpecial(0.6931471805599453);
  bVar2 = NumberUtilities::IsNan(0.6931471805599453);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(0.6931471805599453);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(0.6931471805599453);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00be30ae;
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0xd4,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  uVar3 = NumberUtilities::ToSpecial(1.4426950408889634);
  bVar2 = NumberUtilities::IsNan(1.4426950408889634);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(1.4426950408889634);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(1.4426950408889634);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00be30ae;
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x29,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  uVar3 = NumberUtilities::ToSpecial(0.4342944819032518);
  bVar2 = NumberUtilities::IsNan(0.4342944819032518);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(0.4342944819032518);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(0.4342944819032518);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00be30ae;
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x28,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (mathObject,0x2b,(this->super_JavascriptLibraryBase).pi.ptr,0,0,0,0);
  uVar3 = NumberUtilities::ToSpecial(0.7071067811865476);
  bVar2 = NumberUtilities::IsNan(0.7071067811865476);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(0.7071067811865476);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(0.7071067811865476);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_00be30ae;
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x157,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  uVar3 = NumberUtilities::ToSpecial(1.4142135623730951);
  bVar2 = NumberUtilities::IsNan(1.4142135623730951);
  if (bVar2) {
    uVar4 = NumberUtilities::ToSpecial(1.4142135623730951);
    if (uVar4 != 0xfff8000000000000) {
      uVar4 = NumberUtilities::ToSpecial(1.4142135623730951);
      if (uVar4 != 0x7ff8000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar2) {
LAB_00be30ae:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x158,uVar3 ^ 0xfffc000000000000,0,0,0,0);
  builtInFuncs = &this->field_0x650;
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this_00);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Math_object,this_00);
  }
  else {
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Max,2,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0xfe);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0xfe,pRVar6,6,0,0,0);
    Memory::Recycler::WBSetBit(&this->field_0x770);
    *(RuntimeFunction **)&this->field_0x770 = pRVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x770);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Min,2,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x2a);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x2a,pRVar6,6,0,0,0);
    Memory::Recycler::WBSetBit(&this->field_0x778);
    *(RuntimeFunction **)&this->field_0x778 = pRVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x778);
  }
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Abs,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1d);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x1d,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(builtInFuncs);
  *(RuntimeFunction **)&this->field_0x650 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(builtInFuncs);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Acos,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x1e);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x1e,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x658);
  *(RuntimeFunction **)&this->field_0x658 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x658);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Asin,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x20);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x20,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x660);
  *(RuntimeFunction **)&this->field_0x660 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x660);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Atan,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x21);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x21,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x668);
  *(RuntimeFunction **)&this->field_0x668 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x668);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Atan2,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x22);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x22,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x670);
  *(RuntimeFunction **)&this->field_0x670 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x670);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Cos,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x24);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x24,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x750);
  *(RuntimeFunction **)&this->field_0x750 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x750);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Ceil,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x23);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x23,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x678);
  *(RuntimeFunction **)&this->field_0x678 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x678);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Exp,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x25);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x25,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x758);
  *(RuntimeFunction **)&this->field_0x758 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x758);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Floor,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x26);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x26,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x760);
  *(RuntimeFunction **)&this->field_0x760 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x760);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Log,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x27);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x27,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x768);
  *(RuntimeFunction **)&this->field_0x768 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x768);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Pow,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x2c);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x2c,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x780);
  *(RuntimeFunction **)&this->field_0x780 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x780);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Random,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x2d);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x2d,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7a8);
  *(RuntimeFunction **)&this->field_0x7a8 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7a8);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Round,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x2e);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x2e,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7b0);
  *(RuntimeFunction **)&this->field_0x7b0 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7b0);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Sin,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x2f);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x2f,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7b8);
  *(RuntimeFunction **)&this->field_0x7b8 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7b8);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Sqrt,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x30);
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x30,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7c0);
  *(RuntimeFunction **)&this->field_0x7c0 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7c0);
  pRVar6 = DefaultCreateFunction
                     (this,(FunctionInfo *)Math::EntryInfo::Tan,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x31);
  scriptContext = (ScriptContext *)0x31;
  (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x31,pRVar6,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7c8);
  *(RuntimeFunction **)&this->field_0x7c8 = pRVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7c8);
  pTVar7 = (this_00->config).threadConfig;
  if (pTVar7->m_ES6Math == true) {
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Imul,2,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x40);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x40,pRVar6,6,0,0,0);
    Memory::Recycler::WBSetBit(&this->field_0x788);
    *(RuntimeFunction **)&this->field_0x788 = pRVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x788);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Fround,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x42);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x42,pRVar6,6,0,0,0);
    Memory::Recycler::WBSetBit(&this->field_0x860);
    *(RuntimeFunction **)&this->field_0x860 = pRVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x860);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Log10,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x32);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x32,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Log2,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x33);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x33,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Log1p,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x34);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x34,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Expm1,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x35);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x35,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Cosh,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x36);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x36,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Sinh,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x37);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x37,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Tanh,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x38);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x38,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Acosh,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x39);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x39,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Asinh,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x3a);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x3a,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Atanh,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x3b);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x3b,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Hypot,2,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x3c);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x3c,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Trunc,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x3d);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x3d,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Sign,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x3e);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x3e,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Cbrt,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x3f);
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x3f,pRVar6,6,0,0,0);
    pRVar6 = DefaultCreateFunction
                       (this,(FunctionInfo *)Math::EntryInfo::Clz32,1,(DynamicObject *)0x0,
                        (DynamicType *)0x0,0x41);
    scriptContext = (ScriptContext *)0x41;
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x41,pRVar6,6,0,0,0);
    pTVar7 = (this_00->config).threadConfig;
  }
  if (pTVar7->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar8 = LiteralString::New(type,L"Math",4,this->recycler);
    scriptContext = (ScriptContext *)0x1b;
    (*(mathObject->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(mathObject,0x1b,pLVar8,2,0,0,0);
  }
  CheckRegisteredBuiltIns((Type *)builtInFuncs,scriptContext);
  DynamicObject::SetHasNoEnumerableProperties(mathObject,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeMathObject(DynamicObject* mathObject, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(mathObject, mode, 42);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterMath
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = mathObject->GetScriptContext();
        JavascriptLibrary* library = mathObject->GetLibrary();

        library->AddMember(mathObject, PropertyIds::E,       JavascriptNumber::New(Math::E,       scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LN10,    JavascriptNumber::New(Math::LN10,    scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LN2,     JavascriptNumber::New(Math::LN2,     scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LOG2E,   JavascriptNumber::New(Math::LOG2E,   scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::LOG10E,  JavascriptNumber::New(Math::LOG10E,  scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::PI,      library->pi,                                         PropertyNone);
        library->AddMember(mathObject, PropertyIds::SQRT1_2, JavascriptNumber::New(Math::SQRT1_2, scriptContext), PropertyNone);
        library->AddMember(mathObject, PropertyIds::SQRT2,   JavascriptNumber::New(Math::SQRT2,   scriptContext), PropertyNone);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Math_object, scriptContext);
        }
        else
#endif
        {
            builtinFuncs[BuiltinFunction::Math_Max] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::max, &Math::EntryInfo::Max, 2);
            builtinFuncs[BuiltinFunction::Math_Min] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::min, &Math::EntryInfo::Min, 2);
        }

        builtinFuncs[BuiltinFunction::Math_Abs]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::abs,    &Math::EntryInfo::Abs,    1);
        builtinFuncs[BuiltinFunction::Math_Acos]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::acos,   &Math::EntryInfo::Acos,   1);
        builtinFuncs[BuiltinFunction::Math_Asin]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::asin,   &Math::EntryInfo::Asin,   1);
        builtinFuncs[BuiltinFunction::Math_Atan]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::atan,   &Math::EntryInfo::Atan,   1);
        builtinFuncs[BuiltinFunction::Math_Atan2]  = library->AddFunctionToLibraryObject(mathObject, PropertyIds::atan2,  &Math::EntryInfo::Atan2,  2);
        builtinFuncs[BuiltinFunction::Math_Cos]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::cos,    &Math::EntryInfo::Cos,    1);
        builtinFuncs[BuiltinFunction::Math_Ceil]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::ceil,   &Math::EntryInfo::Ceil,   1);
        builtinFuncs[BuiltinFunction::Math_Exp]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::exp,    &Math::EntryInfo::Exp,    1);
        builtinFuncs[BuiltinFunction::Math_Floor]  = library->AddFunctionToLibraryObject(mathObject, PropertyIds::floor,  &Math::EntryInfo::Floor,  1);
        builtinFuncs[BuiltinFunction::Math_Log]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::log,    &Math::EntryInfo::Log,    1);
        builtinFuncs[BuiltinFunction::Math_Pow]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::pow,    &Math::EntryInfo::Pow,    2);
        builtinFuncs[BuiltinFunction::Math_Random] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::random, &Math::EntryInfo::Random, 0);
        builtinFuncs[BuiltinFunction::Math_Round]  = library->AddFunctionToLibraryObject(mathObject, PropertyIds::round,  &Math::EntryInfo::Round,  1);
        builtinFuncs[BuiltinFunction::Math_Sin]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::sin,    &Math::EntryInfo::Sin,    1);
        builtinFuncs[BuiltinFunction::Math_Sqrt]   = library->AddFunctionToLibraryObject(mathObject, PropertyIds::sqrt,   &Math::EntryInfo::Sqrt,   1);
        builtinFuncs[BuiltinFunction::Math_Tan]    = library->AddFunctionToLibraryObject(mathObject, PropertyIds::tan,    &Math::EntryInfo::Tan,    1);

        if (scriptContext->GetConfig()->IsES6MathExtensionsEnabled())
        {
            builtinFuncs[BuiltinFunction::Math_Imul] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::imul, &Math::EntryInfo::Imul, 2);
            builtinFuncs[BuiltinFunction::Math_Fround] = library->AddFunctionToLibraryObject(mathObject, PropertyIds::fround, &Math::EntryInfo::Fround, 1);
            /*builtinFuncs[BuiltinFunction::Math_Log10] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::log10, &Math::EntryInfo::Log10, 1);
            /*builtinFuncs[BuiltinFunction::Math_Log2]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::log2,  &Math::EntryInfo::Log2,  1);
            /*builtinFuncs[BuiltinFunction::Math_Log1p] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::log1p, &Math::EntryInfo::Log1p, 1);
            /*builtinFuncs[BuiltinFunction::Math_Expm1] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::expm1, &Math::EntryInfo::Expm1, 1);
            /*builtinFuncs[BuiltinFunction::Math_Cosh]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::cosh,  &Math::EntryInfo::Cosh,  1);
            /*builtinFuncs[BuiltinFunction::Math_Sinh]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::sinh,  &Math::EntryInfo::Sinh,  1);
            /*builtinFuncs[BuiltinFunction::Math_Tanh]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::tanh,  &Math::EntryInfo::Tanh,  1);
            /*builtinFuncs[BuiltinFunction::Math_Acosh] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::acosh, &Math::EntryInfo::Acosh, 1);
            /*builtinFuncs[BuiltinFunction::Math_Asinh] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::asinh, &Math::EntryInfo::Asinh, 1);
            /*builtinFuncs[BuiltinFunction::Math_Atanh] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::atanh, &Math::EntryInfo::Atanh, 1);
            /*builtinFuncs[BuiltinFunction::Math_Hypot] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::hypot, &Math::EntryInfo::Hypot, 2);
            /*builtinFuncs[BuiltinFunction::Math_Trunc] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::trunc, &Math::EntryInfo::Trunc, 1);
            /*builtinFuncs[BuiltinFunction::Math_Sign]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::sign,  &Math::EntryInfo::Sign,  1);
            /*builtinFuncs[BuiltinFunction::Math_Cbrt]  =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::cbrt,  &Math::EntryInfo::Cbrt,  1);
            /*builtinFuncs[BuiltinFunction::Math_Clz32] =*/ library->AddFunctionToLibraryObject(mathObject, PropertyIds::clz32, &Math::EntryInfo::Clz32, 1);
        }

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(mathObject, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Math")), PropertyConfigurable);
        }

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        mathObject->SetHasNoEnumerableProperties(true);

        return true;
    }